

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_allocators.h
# Opt level: O1

void * __thiscall
density_tests::DeepTestAllocator<65536UL>::allocate_page_zeroed(DeepTestAllocator<65536UL> *this)

{
  pointer ppIVar1;
  void *i_block;
  pointer ppIVar2;
  
  exception_checkpoint();
  i_block = density::basic_default_allocator<65536UL>::allocate_page_zeroed
                      ((basic_default_allocator<65536UL> *)this);
  SharedBlockRegistry::register_block(&this->m_registry,4,i_block,0xfff0,0x10000,0);
  ppIVar1 = (this->m_hooks).
            super__Vector_base<density_tests::IAllocatorHook_*,_std::allocator<density_tests::IAllocatorHook_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->m_hooks).
                 super__Vector_base<density_tests::IAllocatorHook_*,_std::allocator<density_tests::IAllocatorHook_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppIVar2 != ppIVar1;
      ppIVar2 = ppIVar2 + 1) {
    (*(code *)**(undefined8 **)*ppIVar2)(*ppIVar2,i_block);
  }
  return i_block;
}

Assistant:

void * allocate_page_zeroed()
        {
            exception_checkpoint();

            auto page = Base::allocate_page_zeroed();
            m_registry.register_block(s_page_category, page, page_size, page_alignment, 0);
            invoke_hook(&IAllocatorHook::on_allocated_page, page);
            return page;
        }